

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_2_5::Matrix44<float>::inverse(Matrix44<float> *this,bool singExc)

{
  float fVar1;
  float *pfVar2;
  SingMatrixExc *this_00;
  byte in_DL;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int j_1;
  int i_1;
  float mr;
  int j;
  int i;
  float r;
  Matrix44<float> s;
  undefined4 in_stack_fffffffffffffec4;
  int local_6c;
  int local_68;
  int local_60;
  int local_5c;
  bool in_stack_ffffffffffffffc7;
  Matrix44<float> *in_stack_ffffffffffffffc8;
  
  if ((((in_RSI[3] != 0.0) || (in_RSI[7] != 0.0)) || (in_RSI[0xb] != 0.0)) ||
     (((NAN(in_RSI[0xb]) || (in_RSI[0xf] != 1.0)) || (NAN(in_RSI[0xf]))))) {
    gjInverse(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  }
  else {
    fVar7 = in_RSI[8] * in_RSI[1] + -(*in_RSI * in_RSI[9]);
    Matrix44((Matrix44<float> *)&stack0xffffffffffffffac,
             in_RSI[5] * in_RSI[10] + -(in_RSI[9] * in_RSI[6]),
             in_RSI[9] * in_RSI[2] + -(in_RSI[1] * in_RSI[10]),
             in_RSI[1] * in_RSI[6] + -(in_RSI[5] * in_RSI[2]),0.0,
             in_RSI[8] * in_RSI[6] + -(in_RSI[4] * in_RSI[10]),
             *in_RSI * in_RSI[10] + -(in_RSI[8] * in_RSI[2]),
             in_RSI[4] * in_RSI[2] + -(*in_RSI * in_RSI[6]),0.0,
             in_RSI[4] * in_RSI[9] + -(in_RSI[8] * in_RSI[5]),fVar7,
             *in_RSI * in_RSI[5] + -(in_RSI[4] * in_RSI[1]),0.0,0.0,0.0,0.0,1.0);
    fVar3 = *in_RSI;
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,0);
    fVar4 = *pfVar2;
    fVar5 = in_RSI[1];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,1);
    fVar6 = *pfVar2;
    fVar1 = in_RSI[2];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,2);
    fVar3 = fVar1 * *pfVar2 + fVar3 * fVar4 + fVar5 * fVar6;
    fVar4 = abs<float>(fVar3);
    if (fVar4 < 1.0) {
      fVar4 = abs<float>(fVar3);
      fVar5 = limits<float>::smallest();
      for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
        for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
          pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,local_68);
          fVar6 = abs<float>(pfVar2[local_6c]);
          if (fVar4 / fVar5 <= fVar6) {
            if ((in_DL & 1) == 0) {
              Matrix44((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffec4,fVar7));
              return in_RDI;
            }
            this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
            Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
            __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
          }
          pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,local_68);
          pfVar2[local_6c] = pfVar2[local_6c] / fVar3;
        }
      }
    }
    else {
      for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
        for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
          pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,local_5c);
          pfVar2[local_60] = pfVar2[local_60] / fVar3;
        }
      }
    }
    fVar3 = in_RSI[0xc];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,0);
    fVar4 = *pfVar2;
    fVar5 = in_RSI[0xd];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,1);
    fVar6 = *pfVar2;
    fVar1 = in_RSI[0xe];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,2);
    fVar7 = *pfVar2;
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,3);
    *pfVar2 = -fVar1 * fVar7 + -fVar3 * fVar4 + -(fVar5 * fVar6);
    fVar3 = in_RSI[0xc];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,0);
    fVar4 = pfVar2[1];
    fVar5 = in_RSI[0xd];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,1);
    fVar6 = pfVar2[1];
    fVar1 = in_RSI[0xe];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,2);
    fVar7 = pfVar2[1];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,3);
    pfVar2[1] = -fVar1 * fVar7 + -fVar3 * fVar4 + -(fVar5 * fVar6);
    fVar3 = in_RSI[0xc];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,0);
    fVar4 = pfVar2[2];
    fVar5 = in_RSI[0xd];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,1);
    fVar6 = pfVar2[2];
    fVar1 = in_RSI[0xe];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,2);
    fVar7 = pfVar2[2];
    pfVar2 = operator[]((Matrix44<float> *)&stack0xffffffffffffffac,3);
    pfVar2[2] = -fVar1 * fVar7 + -fVar3 * fVar4 + -(fVar5 * fVar6);
    Matrix44(in_RDI,(Matrix44<float> *)&stack0xffffffffffffffac);
  }
  return in_RDI;
}

Assistant:

Matrix44<T>
Matrix44<T>::inverse (bool singExc) const
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse(singExc);

    Matrix44 s (x[1][1] * x[2][2] - x[2][1] * x[1][2],
                x[2][1] * x[0][2] - x[0][1] * x[2][2],
                x[0][1] * x[1][2] - x[1][1] * x[0][2],
                0,

                x[2][0] * x[1][2] - x[1][0] * x[2][2],
                x[0][0] * x[2][2] - x[2][0] * x[0][2],
                x[1][0] * x[0][2] - x[0][0] * x[1][2],
                0,

                x[1][0] * x[2][1] - x[2][0] * x[1][1],
                x[2][0] * x[0][1] - x[0][0] * x[2][1],
                x[0][0] * x[1][1] - x[1][0] * x[0][1],
                0,

                0,
                0,
                0,
                1);

    T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s[i][j] /= r;
            }
        }
    }
    else
    {
        T mr = IMATH_INTERNAL_NAMESPACE::abs (r) / limits<T>::smallest();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s[i][j]))
                {
                    s[i][j] /= r;
                }
                else
                {
                    if (singExc)
                        throw SingMatrixExc ("Cannot invert singular matrix.");

                    return Matrix44();
                }
            }
        }
    }

    s[3][0] = -x[3][0] * s[0][0] - x[3][1] * s[1][0] - x[3][2] * s[2][0];
    s[3][1] = -x[3][0] * s[0][1] - x[3][1] * s[1][1] - x[3][2] * s[2][1];
    s[3][2] = -x[3][0] * s[0][2] - x[3][1] * s[1][2] - x[3][2] * s[2][2];

    return s;
}